

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.hpp
# Opt level: O1

string * pstore::logger::to_string<unsigned_long>
                   (string *__return_storage_ptr__,czstring message,unsigned_long t)

{
  bool bVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  unsigned_long uVar5;
  size_type *psVar6;
  char cVar7;
  string __str;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  cVar7 = '\x01';
  if (9 < t) {
    uVar5 = t;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_001dbb92;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_001dbb92;
      }
      if (uVar5 < 10000) goto LAB_001dbb92;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_001dbb92:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48,local_40,t);
  strlen(message);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_48,0,(char *)0x0,(ulong)message);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar2 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string (gsl::czstring const message, T const t) {
                return message + std::to_string (t);
            }